

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_stats_table_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  uint uVar2;
  undefined4 uVar3;
  parasail_result_t *ppVar4;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  long lVar5;
  int iVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t size;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  size_t size_00;
  int local_104;
  uint local_f8;
  int local_f4;
  int local_cc;
  int local_c8;
  int local_c4;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_stats_table_scan_cold_8();
  }
  else if (s2Len < 1) {
    parasail_sg_flags_stats_table_scan_cold_7();
  }
  else if (open < 0) {
    parasail_sg_flags_stats_table_scan_cold_6();
  }
  else if (gap < 0) {
    parasail_sg_flags_stats_table_scan_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_stats_table_scan_cold_4();
  }
  else {
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_sg_flags_stats_table_scan_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_sg_flags_stats_table_scan_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sg_flags_stats_table_scan_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    ppVar4 = parasail_result_new_table3(_s1Len,s2Len);
    if (ppVar4 != (parasail_result_t *)0x0) {
      ppVar4->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar4->flag |
                     0x1430202;
      size = (size_t)_s1Len;
      ptr = parasail_memalign_int(0x10,size);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      size_00 = (size_t)(int)(_s1Len + 1);
      ptr_01 = parasail_memalign_int(0x10,size_00);
      ptr_02 = parasail_memalign_int(0x10,size_00);
      ptr_03 = parasail_memalign_int(0x10,size_00);
      ptr_04 = parasail_memalign_int(0x10,size_00);
      ptr_05 = parasail_memalign_int(0x10,size);
      ptr_06 = parasail_memalign_int(0x10,size);
      ptr_07 = parasail_memalign_int(0x10,size);
      ptr_08 = parasail_memalign_int(0x10,size);
      ptr_09 = parasail_memalign_int(0x10,size_00);
      ptr_10 = parasail_memalign_int(0x10,size_00);
      ptr_11 = parasail_memalign_int(0x10,size_00);
      ptr_12 = parasail_memalign_int(0x10,size_00);
      ptr_13 = parasail_memalign_int(0x10,size);
      if (ptr == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_00 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_01 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_02 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_03 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_04 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_05 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_06 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_07 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_08 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_09 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_10 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_11 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_12 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      if (ptr_13 == (int *)0x0) {
        return (parasail_result_t *)0x0;
      }
      uVar13 = (ulong)(uint)_s1Len;
      if (0 < _s1Len) {
        piVar1 = matrix->mapper;
        uVar8 = 0;
        do {
          ptr[uVar8] = piVar1[(byte)_s1[uVar8]];
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
      piVar1 = matrix->mapper;
      uVar8 = 1;
      if (1 < s2Len) {
        uVar8 = (ulong)(uint)s2Len;
      }
      uVar10 = 0;
      do {
        ptr_00[uVar10] = piVar1[(byte)_s2[uVar10]];
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      *ptr_01 = 0;
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_09 = 0;
      if (s1_beg == 0) {
        if (0 < _s1Len) {
          iVar6 = -open;
          uVar8 = 0;
          do {
            ptr_01[uVar8 + 1] = iVar6;
            ptr_02[uVar8 + 1] = 0;
            ptr_03[uVar8 + 1] = 0;
            ptr_04[uVar8 + 1] = 0;
            uVar8 = uVar8 + 1;
            iVar6 = iVar6 - gap;
          } while (uVar13 != uVar8);
        }
      }
      else if (0 < _s1Len) {
        uVar8 = 0;
        do {
          ptr_01[uVar8 + 1] = 0;
          ptr_02[uVar8 + 1] = 0;
          ptr_03[uVar8 + 1] = 0;
          ptr_04[uVar8 + 1] = 0;
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
      if (0 < _s1Len) {
        uVar8 = 0;
        do {
          ptr_05[uVar8] = -0x40000000;
          ptr_06[uVar8] = 0;
          ptr_07[uVar8] = 0;
          ptr_08[uVar8] = 0;
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
      }
      uVar2 = _s1Len - 1;
      uVar8 = 1;
      if (1 < s2Len) {
        uVar8 = (ulong)(uint)s2Len;
      }
      local_104 = -0x40000000;
      uVar10 = 0;
      local_cc = 0;
      local_c8 = 0;
      local_c4 = 0;
      local_f8 = _s1Len;
      local_f4 = s2Len;
      do {
        if (0 < _s1Len) {
          lVar5 = 0;
          do {
            iVar6 = *(int *)((long)ptr_01 + lVar5 + 4) - open;
            iVar11 = *(int *)((long)ptr_05 + lVar5) - gap;
            if (iVar11 < iVar6) {
              *(int *)((long)ptr_05 + lVar5) = iVar6;
              *(undefined4 *)((long)ptr_06 + lVar5) = *(undefined4 *)((long)ptr_02 + lVar5 + 4);
              *(undefined4 *)((long)ptr_07 + lVar5) = *(undefined4 *)((long)ptr_03 + lVar5 + 4);
              *(undefined4 *)((long)ptr_08 + lVar5) = *(undefined4 *)((long)ptr_04 + lVar5 + 4);
            }
            else {
              *(int *)((long)ptr_05 + lVar5) = iVar11;
            }
            *(int *)((long)ptr_08 + lVar5) = *(int *)((long)ptr_08 + lVar5) + 1;
            lVar5 = lVar5 + 4;
          } while (uVar13 * 4 - lVar5 != 0);
        }
        iVar6 = -((int)uVar10 * gap + open);
        if (s2_beg != 0) {
          iVar6 = 0;
        }
        *ptr_09 = iVar6;
        if (0 < _s1Len) {
          piVar1 = matrix->matrix;
          uVar9 = 0;
          do {
            if (matrix->type == 0) {
              iVar11 = ptr[uVar9] * matrix->size;
            }
            else {
              iVar11 = matrix->size * (int)uVar9;
            }
            iVar11 = piVar1[(long)iVar11 + (long)ptr_00[uVar10]];
            iVar12 = ptr_01[uVar9] + iVar11;
            ptr_13[uVar9] = (uint)(iVar12 < ptr_05[uVar9]);
            if (iVar12 < ptr_05[uVar9]) {
              ptr_09[uVar9 + 1] = ptr_05[uVar9];
              ptr_10[uVar9 + 1] = ptr_06[uVar9];
              ptr_11[uVar9 + 1] = ptr_07[uVar9];
              iVar11 = ptr_08[uVar9];
            }
            else {
              ptr_09[uVar9 + 1] = iVar12;
              ptr_10[uVar9 + 1] = (uint)(ptr[uVar9] == ptr_00[uVar10]) + ptr_02[uVar9];
              ptr_11[uVar9 + 1] = (uint)(0 < iVar11) + ptr_03[uVar9];
              iVar11 = ptr_04[uVar9] + 1;
            }
            ptr_12[uVar9 + 1] = iVar11;
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (0 < _s1Len) {
          iVar12 = -0x40000000;
          lVar5 = 0;
          iVar11 = 0;
          uVar7 = 0;
          uVar3 = 0;
          uVar9 = uVar10;
          do {
            iVar14 = iVar12 - gap;
            iVar12 = *(int *)((long)ptr_09 + lVar5);
            if (*(int *)((long)ptr_09 + lVar5) <= iVar14) {
              iVar12 = iVar14;
            }
            if (iVar14 < *(int *)((long)ptr_01 + lVar5)) {
              uVar3 = *(undefined4 *)((long)ptr_02 + lVar5);
              uVar7 = *(undefined4 *)((long)ptr_03 + lVar5);
              iVar11 = *(int *)((long)ptr_04 + lVar5);
            }
            iVar15 = iVar12 - open;
            iVar11 = iVar11 + 1;
            iVar14 = *(int *)((long)ptr_09 + lVar5 + 4);
            if (iVar15 < iVar14) {
              *(int *)((long)ptr_01 + lVar5 + 4) = iVar14;
              uVar16 = *(undefined4 *)((long)ptr_10 + lVar5 + 4);
LAB_0055731c:
              *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar16;
              *(undefined4 *)((long)ptr_03 + lVar5 + 4) = *(undefined4 *)((long)ptr_11 + lVar5 + 4);
              iVar14 = *(int *)((long)ptr_12 + lVar5 + 4);
            }
            else {
              *(int *)((long)ptr_01 + lVar5 + 4) = iVar15;
              if ((*(int *)((long)ptr_09 + lVar5 + 4) == iVar15) &&
                 (*(int *)((long)ptr_13 + lVar5) == 0)) {
                uVar16 = *(undefined4 *)((long)ptr_10 + lVar5 + 4);
                goto LAB_0055731c;
              }
              *(undefined4 *)((long)ptr_02 + lVar5 + 4) = uVar3;
              *(undefined4 *)((long)ptr_03 + lVar5 + 4) = uVar7;
              iVar14 = iVar11;
            }
            *(int *)((long)ptr_04 + lVar5 + 4) = iVar14;
            *(undefined4 *)(*((ppVar4->field_4).trace)->trace_del_table + uVar9 * 4) =
                 *(undefined4 *)((long)ptr_01 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar4->field_4).trace)->trace_del_table + 8) + uVar9 * 4) =
                 *(undefined4 *)((long)ptr_02 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar4->field_4).trace)->trace_del_table + 0x10) + uVar9 * 4) =
                 *(undefined4 *)((long)ptr_03 + lVar5 + 4);
            *(undefined4 *)
             (*(long *)((long)((ppVar4->field_4).trace)->trace_del_table + 0x18) + uVar9 * 4) =
                 *(undefined4 *)((long)ptr_04 + lVar5 + 4);
            lVar5 = lVar5 + 4;
            uVar9 = uVar9 + (uint)s2Len;
          } while (uVar13 * 4 - lVar5 != 0);
        }
        *ptr_01 = iVar6;
        if ((s2_end != 0) && (local_104 < ptr_01[(long)(int)uVar2 + 1])) {
          local_c4 = ptr_02[(long)(int)uVar2 + 1];
          local_c8 = ptr_03[(long)(int)uVar2 + 1];
          local_cc = ptr_04[(long)(int)uVar2 + 1];
          local_104 = ptr_01[(long)(int)uVar2 + 1];
          local_f8 = uVar2;
          local_f4 = (int)uVar10;
        }
        uVar10 = uVar10 + 1;
        if (uVar10 == uVar8) {
          if (s1_end == 0 || s2_end == 0) {
            if (s1_end != 0 && 0 < _s1Len) {
              uVar8 = 0;
              do {
                if (local_104 < ptr_01[uVar8 + 1]) {
                  local_c4 = ptr_02[uVar8 + 1];
                  local_c8 = ptr_03[uVar8 + 1];
                  local_cc = ptr_04[uVar8 + 1];
                  local_f8 = (uint)uVar8;
                  local_104 = ptr_01[uVar8 + 1];
                  local_f4 = s2Len + -1;
                }
                uVar8 = uVar8 + 1;
              } while (uVar13 != uVar8);
            }
          }
          else if (0 < _s1Len) {
            uVar8 = 0;
            do {
              iVar6 = ptr_01[uVar8 + 1];
              if ((local_104 < iVar6) ||
                 (((iVar6 == local_104 && (local_f4 == s2Len + -1)) &&
                  (iVar6 = local_104, (long)uVar8 < (long)(int)local_f8)))) {
                local_c4 = ptr_02[uVar8 + 1];
                local_c8 = ptr_03[uVar8 + 1];
                local_cc = ptr_04[uVar8 + 1];
                local_f8 = (uint)uVar8;
                local_104 = iVar6;
                local_f4 = s2Len + -1;
              }
              uVar8 = uVar8 + 1;
            } while (uVar13 != uVar8);
          }
          if (s2_end == 0 && s1_end == 0) {
            local_f8 = _s1Len - 1;
            local_104 = ptr_01[size];
            local_c4 = ptr_02[size];
            local_c8 = ptr_03[size];
            local_cc = ptr_04[size];
            local_f4 = s2Len + -1;
          }
          ppVar4->score = local_104;
          ppVar4->end_query = local_f8;
          ppVar4->end_ref = local_f4;
          ((ppVar4->field_4).stats)->matches = local_c4;
          ((ppVar4->field_4).stats)->similar = local_c8;
          ((ppVar4->field_4).stats)->length = local_cc;
          parasail_free(ptr_13);
          parasail_free(ptr_12);
          parasail_free(ptr_11);
          parasail_free(ptr_10);
          parasail_free(ptr_09);
          parasail_free(ptr_08);
          parasail_free(ptr_07);
          parasail_free(ptr_06);
          parasail_free(ptr_05);
          parasail_free(ptr_04);
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          return ppVar4;
        }
      } while( true );
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict HMB = NULL;
    int * restrict HM = NULL;
    int * restrict HSB = NULL;
    int * restrict HS = NULL;
    int * restrict HLB = NULL;
    int * restrict HL = NULL;
    int * restrict E = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB = NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB = NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB = NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = 0;
    similar = 0;
    length = 0;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
            HM[i] = 0;
            HS[i] = 0;
            HL[i] = 0;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1];
            }
            FtL += 1;
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
        /* last value from column */
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            matches = HM[s1Len-1];
            similar = HS[s1Len-1];
            length = HL[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    /* max of last column */
    if (s1_end && s2_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
            else if (H[i] == score && end_ref == s2Len-1 && i < end_query) {
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    else if (s1_end) {
        for (i=0; i<s1Len; ++i) {
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = s2Len-1;
            }
        }
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        matches = HM[s1Len-1];
        similar = HS[s1Len-1];
        length = HL[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}